

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  undefined1 auVar2 [64];
  ushort uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 __ptr;
  undefined8 __ptr_00;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uchar *puVar11;
  uint *bitlen;
  undefined1 (*bitlen_00) [64];
  undefined1 (*bitlen_01) [64];
  uint uVar12;
  ulong uVar13;
  long lVar14;
  undefined4 *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  undefined4 *puVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  undefined1 (*pauVar27) [64];
  uint uVar28;
  uint result;
  ulong uVar29;
  uint result_1;
  int iVar30;
  uint uVar31;
  int iVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  HuffmanTree tree_ll;
  size_t *local_110;
  uchar *local_108;
  ulong local_c8;
  undefined1 local_a8 [16];
  uint *local_98;
  uint local_8c;
  undefined1 local_88 [16];
  uint *local_78;
  uint local_6c;
  undefined1 local_68 [16];
  uint *local_58;
  uint local_4c;
  uchar **local_40;
  ulong *local_38;
  
  local_108 = *out;
  uVar24 = *outsize;
  uVar1 = insize * 8;
  uVar17 = 0;
  uVar25 = 0;
  bVar22 = 0;
  local_110 = (size_t *)0x0;
  local_c8 = uVar24;
  local_40 = out;
  local_38 = outsize;
  do {
    if (bVar22 != 0) {
      uVar9 = (uint)local_110;
      break;
    }
    uVar10 = uVar17 + 2;
    if (uVar10 < uVar1) {
      bVar22 = in[uVar17 >> 3] >> ((byte)uVar17 & 7) & 1;
      uVar18 = uVar17 + 3;
      bVar8 = (in[uVar10 >> 3] >> ((byte)uVar10 & 7)) * '\x02' & 2 |
              (in[uVar17 + 1 >> 3] >> ((uint)(uVar17 + 1) & 7) & 1) != 0;
      if (bVar8 == 3) {
        outsize = (size_t *)0x14;
        bVar33 = false;
        uVar17 = uVar18;
      }
      else {
        if (bVar8 == 0) {
          uVar10 = (ulong)((uint)uVar18 & 7);
          uVar17 = uVar17 + 4 + (uVar10 ^ 7);
          if (uVar10 == 0) {
            uVar17 = uVar18;
          }
          uVar18 = uVar17;
          uVar10 = uVar18 >> 3;
          uVar17 = uVar10 + 4;
          if (uVar17 < insize) {
            uVar3 = *(ushort *)(in + uVar10);
            uVar19 = (uint)uVar3;
            uVar9 = (uint)uVar3;
            if (*(ushort *)(in + uVar10 + 2) + uVar9 == 0xffff) {
              uVar10 = uVar25 + uVar9;
              if (uVar24 < uVar10) {
                uVar23 = uVar10 * 3 >> 1;
                if (uVar24 * 2 < uVar10) {
                  uVar23 = uVar10;
                }
                puVar11 = (uchar *)realloc(local_108,uVar23);
                bVar33 = puVar11 == (uchar *)0x0;
                if (!bVar33) {
                  uVar24 = uVar23;
                  local_108 = puVar11;
                }
                outsize = (size_t *)((ulong)outsize & 0xffffffff);
              }
              else {
                bVar33 = false;
              }
              local_110 = (size_t *)0x53;
              if ((!bVar33) &&
                 (local_110 = (size_t *)0x17, local_c8 = uVar10, uVar9 + uVar17 <= insize)) {
                if (uVar3 != 0) {
                  do {
                    puVar11 = in + uVar17;
                    uVar17 = uVar17 + 1;
                    local_108[uVar25] = *puVar11;
                    uVar25 = uVar25 + 1;
                    uVar19 = uVar19 - 1;
                  } while (uVar19 != 0);
                }
                uVar18 = uVar17 << 3;
                local_110 = (size_t *)0x0;
              }
            }
            else {
              local_110 = (size_t *)0x15;
            }
          }
          else {
            local_110 = (size_t *)0x34;
          }
        }
        else {
          local_88 = (undefined1  [16])0x0;
          local_110 = (size_t *)0x0;
          local_78 = (uint *)0x0;
          local_a8 = (undefined1  [16])0x0;
          local_98 = (uint *)0x0;
          if (bVar8 == 2) {
            uVar10 = uVar17 + 0x11;
            local_110 = (size_t *)0x31;
            if (uVar10 <= uVar1) {
              uVar9 = 0;
              iVar32 = 0;
              do {
                uVar19 = uVar9 & 0x1f;
                iVar32 = iVar32 + ((in[uVar18 >> 3] >> ((byte)uVar18 & 7) & 1) << uVar19);
                uVar18 = uVar18 + 1;
                uVar9 = uVar9 + 1;
              } while (uVar9 != 5);
              uVar17 = uVar17 + 8;
              uVar19 = 0 << uVar19;
              iVar30 = 0;
              do {
                iVar30 = iVar30 + ((in[uVar17 >> 3] >> ((byte)uVar17 & 7) & 1) << (uVar19 & 0x1f));
                uVar17 = uVar17 + 1;
                uVar19 = uVar19 + 1;
              } while (uVar19 != 5);
              auVar35 = vpbroadcastq_avx512vl();
              auVar35 = vpaddq_avx2(auVar35,_DAT_00462be0);
              auVar34 = vpbroadcastd_avx512vl();
              auVar5 = vpmovsxbd_avx(ZEXT416(0x3020100));
              auVar34 = vpaddd_avx(auVar34,auVar5);
              auVar35 = vpsrlq_avx2(auVar35,3);
              lVar14 = vpextrq_avx(auVar35._0_16_,1);
              lVar16 = vpextrq_avx(auVar35._16_16_,1);
              auVar36 = vpinsrb_avx(ZEXT116(in[auVar35._0_8_]),(uint)in[lVar14],4);
              auVar36 = vpinsrb_avx(auVar36,(uint)in[auVar35._16_8_],8);
              auVar36 = vpinsrb_avx(auVar36,(uint)in[lVar16],0xc);
              auVar6._8_4_ = 7;
              auVar6._0_8_ = 0x700000007;
              auVar6._12_4_ = 7;
              auVar34 = vpandd_avx512vl(auVar34,auVar6);
              auVar34 = vpsrlvd_avx2(auVar36,auVar34);
              auVar36._8_4_ = 1;
              auVar36._0_8_ = 0x100000001;
              auVar36._12_4_ = 1;
              auVar34 = vpandd_avx512vl(auVar34,auVar36);
              auVar34 = vpsllvd_avx2(auVar34,auVar5);
              auVar34 = vpmovdb_avx512vl(auVar34);
              auVar34 = vpsadbw_avx(ZEXT416(auVar34._0_4_),(undefined1  [16])0x0);
              uVar9 = auVar34._0_4_ + 4;
              uVar18 = uVar10;
              if (uVar1 < uVar9 * 3 + uVar10) {
                local_110 = (size_t *)0x32;
              }
              else {
                local_68 = (undefined1  [16])0x0;
                local_58 = (uint *)0x0;
                bitlen = (uint *)malloc(0x4c);
                if (bitlen == (uint *)0x0) {
                  bitlen_00 = (undefined1 (*) [64])0x0;
                  bitlen_01 = (undefined1 (*) [64])0x0;
                  bitlen = (uint *)0x0;
                  local_110 = (size_t *)0x53;
                }
                else {
                  uVar19 = iVar32 + 0x101;
                  uVar17 = 0;
                  do {
                    uVar12 = 0;
                    if (uVar17 < uVar9) {
                      uVar31 = 0;
                      uVar12 = 0;
                      uVar10 = uVar18;
                      do {
                        uVar12 = uVar12 + ((in[uVar10 >> 3] >> ((uint)uVar10 & 7) & 1) <<
                                          (uVar31 & 0x1f));
                        uVar10 = uVar10 + 1;
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != 3);
                      uVar18 = uVar18 + 3;
                    }
                    bitlen[CLCL_ORDER[uVar17]] = uVar12;
                    uVar17 = uVar17 + 1;
                  } while (uVar17 != 0x13);
                  uVar9 = HuffmanTree_makeFromLengths((HuffmanTree *)local_68,bitlen,0x13,7);
                  if (uVar9 == 0) {
                    bitlen_00 = (undefined1 (*) [64])malloc(0x480);
                    bitlen_01 = (undefined1 (*) [64])malloc(0x80);
                    if (bitlen_01 == (undefined1 (*) [64])0x0 ||
                        bitlen_00 == (undefined1 (*) [64])0x0) {
                      local_110 = (size_t *)0x53;
                    }
                    else {
                      uVar17 = 0;
                      memset(bitlen_00,0,0x480);
                      auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
                      *bitlen_01 = auVar2;
                      auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
                      bitlen_01[1] = auVar2;
                      uVar9 = iVar30 + 0x102 + iVar32;
                      uVar23 = (ulong)uVar9;
                      uVar10 = (ulong)uVar19;
                      iVar30 = -0x101 - iVar32;
                      local_110 = (size_t *)0x0;
                      do {
                        uVar12 = (uint)uVar17;
                        if (uVar9 <= uVar12) break;
                        uVar29 = uVar1;
                        if (uVar1 < uVar18) {
                          uVar29 = uVar18;
                        }
                        uVar31 = 0;
                        while (uVar13 = uVar29, uVar28 = 0xffffffff, uVar29 != uVar18) {
                          uVar28 = *(uint *)(local_68._0_8_ +
                                            (ulong)((in[uVar18 >> 3] >> ((byte)uVar18 & 7) & 1) +
                                                   uVar31 * 2) * 4);
                          uVar13 = uVar18 + 1;
                          uVar31 = uVar28 - local_4c;
                          if ((uVar28 < local_4c) ||
                             (uVar18 = uVar13, uVar28 = 0xffffffff, local_4c <= uVar31)) break;
                        }
                        uVar18 = uVar13;
                        if (uVar28 < 0x10) {
                          pauVar27 = bitlen_01;
                          uVar31 = uVar19;
                          if (uVar12 < uVar19) {
                            pauVar27 = bitlen_00;
                            uVar31 = 0;
                          }
                          *(uint *)(*pauVar27 + (ulong)(uVar12 - uVar31) * 4) = uVar28;
                          uVar17 = (ulong)(uVar12 + 1);
LAB_0030b7cf:
                          iVar26 = 0;
                        }
                        else {
                          iVar26 = 0xe;
                          if ((int)uVar28 < 0x11) {
                            if (uVar28 == 0xffffffff) {
                              local_110 = (size_t *)(ulong)(0xb - (uVar1 < uVar13));
                            }
                            else if (uVar28 == 0x10) {
                              if (uVar12 == 0) {
                                local_110 = (size_t *)0x36;
                                uVar17 = 0;
                                bVar33 = false;
                                iVar26 = 0xe;
                              }
                              else {
                                uVar18 = uVar13 + 2;
                                iVar26 = 0;
                                if (uVar1 < uVar18) {
                                  local_110 = (size_t *)0x32;
                                  bVar33 = false;
                                  uVar18 = uVar13;
                                  iVar26 = 0xe;
                                }
                                else {
                                  auVar34 = vpbroadcastq_avx512vl();
                                  auVar36 = vpaddq_avx(auVar34,_DAT_00466ff0);
                                  auVar34 = vpbroadcastd_avx512vl();
                                  auVar37._8_8_ = 0x100000000;
                                  auVar37._0_8_ = 0x100000000;
                                  auVar34 = vpaddd_avx(auVar34,auVar37);
                                  auVar36 = vpsrlq_avx(auVar36,3);
                                  lVar14 = vpextrq_avx(auVar36,1);
                                  auVar36 = vpinsrb_avx(ZEXT116(in[auVar36._0_8_]),(uint)in[lVar14],
                                                        4);
                                  auVar5._8_4_ = 7;
                                  auVar5._0_8_ = 0x700000007;
                                  auVar5._12_4_ = 7;
                                  auVar34 = vpandd_avx512vl(auVar34,auVar5);
                                  auVar34 = vpsrlvd_avx2(auVar36,auVar34);
                                  auVar7._8_4_ = 1;
                                  auVar7._0_8_ = 0x100000001;
                                  auVar7._12_4_ = 1;
                                  auVar34 = vpandd_avx512vl(auVar34,auVar7);
                                  auVar34 = vpsllvd_avx2(auVar34,auVar37);
                                  auVar34 = vphaddd_avx(auVar34,auVar34);
                                  puVar15 = (undefined4 *)
                                            (*bitlen_01 + (ulong)((uVar12 - iVar32) - 0x102) * 4);
                                  if (uVar12 < iVar32 + 0x102U) {
                                    puVar15 = (undefined4 *)(*bitlen_00 + (ulong)(uVar12 - 1) * 4);
                                  }
                                  iVar20 = auVar34._0_4_ + 3;
                                  bVar33 = true;
                                  if (iVar20 != 0) {
                                    uVar4 = *puVar15;
                                    uVar17 = uVar17 & 0xffffffff;
                                    uVar29 = uVar23;
                                    if (uVar23 < uVar17) {
                                      uVar29 = uVar17;
                                    }
                                    puVar15 = (undefined4 *)(*bitlen_00 + uVar17 * 4);
                                    do {
                                      if (uVar29 == uVar17) {
                                        local_110 = (size_t *)0xd;
                                        break;
                                      }
                                      puVar21 = (undefined4 *)
                                                (*bitlen_01 +
                                                (ulong)(uint)(iVar30 + (int)uVar17) * 4);
                                      if (uVar17 < uVar10) {
                                        puVar21 = puVar15;
                                      }
                                      *puVar21 = uVar4;
                                      uVar17 = uVar17 + 1;
                                      puVar15 = puVar15 + 1;
                                      iVar20 = iVar20 + -1;
                                    } while (iVar20 != 0);
                                    bVar33 = true;
                                    iVar26 = 0;
                                  }
                                }
                              }
                              if (bVar33) goto LAB_0030b7cf;
                            }
                            else {
LAB_0030b8e8:
                              local_110 = (size_t *)0x10;
                            }
                          }
                          else {
                            if (uVar28 == 0x11) {
                              uVar18 = uVar13 + 3;
                              uVar29 = uVar18;
                              if (uVar1 < uVar18) {
LAB_0030b914:
                                local_110 = (size_t *)0x32;
                                uVar18 = uVar13;
                                iVar26 = 0xe;
                              }
                              else {
                                uVar12 = 0;
                                iVar20 = 0;
                                do {
                                  uVar31 = uVar12 & 0x1f;
                                  iVar20 = iVar20 + ((in[uVar13 >> 3] >> ((byte)uVar13 & 7) & 1) <<
                                                    uVar31);
                                  uVar13 = uVar13 + 1;
                                  uVar12 = uVar12 + 1;
                                } while (uVar12 != 3);
                                iVar26 = 0 << uVar31;
                                iVar20 = iVar20 + 3;
                                if (iVar20 != 0) {
                                  uVar17 = uVar17 & 0xffffffff;
                                  uVar13 = uVar23;
                                  if (uVar23 < uVar17) {
                                    uVar13 = uVar17;
                                  }
                                  puVar15 = (undefined4 *)(*bitlen_00 + uVar17 * 4);
                                  do {
                                    if (uVar13 == uVar17) {
                                      local_110 = (size_t *)0xe;
                                      break;
                                    }
                                    puVar21 = (undefined4 *)
                                              (*bitlen_01 + (ulong)(uint)(iVar30 + (int)uVar17) * 4)
                                    ;
                                    if (uVar17 < uVar10) {
                                      puVar21 = puVar15;
                                    }
                                    *puVar21 = 0;
                                    uVar17 = uVar17 + 1;
                                    puVar15 = puVar15 + 1;
                                    iVar20 = iVar20 + -1;
                                  } while (iVar20 != 0);
                                }
                              }
                            }
                            else {
                              if (uVar28 != 0x12) goto LAB_0030b8e8;
                              uVar18 = uVar13 + 7;
                              uVar29 = uVar18;
                              if (uVar1 < uVar18) goto LAB_0030b914;
                              uVar12 = 0;
                              iVar20 = 0;
                              do {
                                uVar31 = uVar12 & 0x1f;
                                iVar20 = iVar20 + ((in[uVar13 >> 3] >> ((byte)uVar13 & 7) & 1) <<
                                                  uVar31);
                                uVar13 = uVar13 + 1;
                                uVar12 = uVar12 + 1;
                              } while (uVar12 != 7);
                              iVar26 = 0 << uVar31;
                              iVar20 = iVar20 + 0xb;
                              if (iVar20 != 0) {
                                uVar17 = uVar17 & 0xffffffff;
                                uVar13 = uVar23;
                                if (uVar23 < uVar17) {
                                  uVar13 = uVar17;
                                }
                                puVar15 = (undefined4 *)(*bitlen_00 + uVar17 * 4);
                                do {
                                  if (uVar13 == uVar17) {
                                    local_110 = (size_t *)0xf;
                                    break;
                                  }
                                  puVar21 = (undefined4 *)
                                            (*bitlen_01 + (ulong)(uint)(iVar30 + (int)uVar17) * 4);
                                  if (uVar17 < uVar10) {
                                    puVar21 = puVar15;
                                  }
                                  *puVar21 = 0;
                                  uVar17 = uVar17 + 1;
                                  puVar15 = puVar15 + 1;
                                  iVar20 = iVar20 + -1;
                                } while (iVar20 != 0);
                              }
                            }
                            if (uVar29 <= uVar1) goto LAB_0030b7cf;
                          }
                        }
                      } while (iVar26 == 0);
                      if ((int)local_110 == 0) {
                        if (*(int *)bitlen_00[0x10] == 0) {
                          local_110 = (size_t *)0x40;
                        }
                        else {
                          uVar9 = HuffmanTree_makeFromLengths
                                            ((HuffmanTree *)local_88,(uint *)bitlen_00,0x120,0xf);
                          if (uVar9 == 0) {
                            uVar9 = HuffmanTree_makeFromLengths
                                              ((HuffmanTree *)local_a8,(uint *)bitlen_01,0x20,0xf);
                            local_110 = (size_t *)(ulong)uVar9;
                          }
                          else {
                            local_110 = (size_t *)(ulong)uVar9;
                          }
                        }
                      }
                    }
                  }
                  else {
                    local_110 = (size_t *)(ulong)uVar9;
                    bitlen_00 = (undefined1 (*) [64])0x0;
                    bitlen_01 = (undefined1 (*) [64])0x0;
                  }
                }
                free(bitlen);
                free(bitlen_00);
                free(bitlen_01);
                free((void *)local_68._0_8_);
                free((void *)local_68._8_8_);
                free(local_58);
              }
            }
          }
          else if (bVar8 == 1) {
            generateFixedLitLenTree((HuffmanTree *)local_88);
            generateFixedDistanceTree((HuffmanTree *)local_a8);
            local_110 = (size_t *)0x0;
          }
          uVar19 = local_6c;
          uVar9 = local_8c;
          __ptr_00 = local_88._0_8_;
          __ptr = local_a8._0_8_;
          uVar17 = uVar25;
          do {
            uVar25 = uVar17;
            if ((int)local_110 != 0) break;
            uVar10 = uVar1;
            if (uVar1 < uVar18) {
              uVar10 = uVar18;
            }
            uVar12 = 0;
            uVar23 = uVar18;
            while (uVar18 = uVar10, uVar31 = 0xffffffff, uVar10 != uVar23) {
              uVar31 = *(uint *)(__ptr_00 +
                                (ulong)((in[uVar23 >> 3] >> ((uint)uVar23 & 7) & 1) + uVar12 * 2) *
                                4);
              uVar18 = uVar23 + 1;
              uVar12 = uVar31 - uVar19;
              if ((uVar31 < uVar19) || (uVar23 = uVar18, uVar31 = 0xffffffff, uVar19 <= uVar12))
              break;
            }
            if (uVar31 < 0x100) {
              uVar25 = uVar17 + 1;
              if (uVar24 < uVar25) {
                uVar10 = uVar25 * 3 >> 1;
                if (uVar24 * 2 < uVar25) {
                  uVar10 = uVar25;
                }
                puVar11 = (uchar *)realloc(local_108,uVar10);
                bVar33 = puVar11 == (uchar *)0x0;
                if (!bVar33) {
                  uVar24 = uVar10;
                  local_108 = puVar11;
                }
              }
              else {
                bVar33 = false;
              }
              bVar33 = !bVar33;
              if (bVar33) {
                local_108[uVar17] = (uchar)uVar31;
                local_c8 = uVar25;
              }
              else {
                local_110 = (size_t *)0x53;
                uVar25 = uVar17;
              }
            }
            else {
              if (uVar31 < 0x11e && uVar31 != 0x100) {
                uVar10 = (ulong)(uVar31 - 0x101);
                uVar12 = LENGTHEXTRA[uVar10];
                if (uVar1 < uVar18 + uVar12) {
LAB_0030b09b:
                  bVar33 = false;
                  local_110 = (size_t *)0x33;
                  goto LAB_0030b1ea;
                }
                if (uVar10 - 0x1c < 0xffffffffffffffec) {
                  uVar29 = 0;
                }
                else {
                  uVar31 = 0;
                  uVar29 = 0;
                  uVar23 = uVar18;
                  do {
                    uVar29 = (ulong)((int)uVar29 +
                                    ((in[uVar23 >> 3] >> ((byte)uVar23 & 7) & 1) << (uVar31 & 0x1f))
                                    );
                    uVar23 = uVar23 + 1;
                    uVar31 = uVar31 + 1;
                  } while (uVar12 != uVar31);
                  uVar18 = uVar18 + 1 + (ulong)(uVar12 - 1);
                }
                uVar29 = LENGTHBASE[uVar10] + uVar29;
                uVar10 = uVar1;
                if (uVar1 < uVar18) {
                  uVar10 = uVar18;
                }
                uVar12 = 0;
                uVar23 = uVar18;
                do {
                  uVar13 = 0xffffffff;
                  uVar18 = uVar10;
                  if (uVar10 == uVar23) break;
                  uVar31 = *(uint *)(__ptr + (ulong)((in[uVar23 >> 3] >> ((byte)uVar23 & 7) & 1) +
                                                    uVar12 * 2) * 4);
                  uVar18 = uVar23 + 1;
                  uVar12 = uVar31 - uVar9;
                  if (uVar31 < uVar9) {
                    uVar13 = (ulong)uVar31;
                    break;
                  }
                  uVar23 = uVar18;
                } while (uVar12 < uVar9);
                if ((uint)uVar13 < 0x1e) {
                  uVar12 = DISTANCEEXTRA[uVar13];
                  iVar32 = 0;
                  if (uVar1 < uVar18 + uVar12) goto LAB_0030b09b;
                  if (3 < (uint)uVar13) {
                    uVar31 = 0;
                    iVar32 = 0;
                    uVar10 = uVar18;
                    do {
                      iVar32 = iVar32 + ((in[uVar10 >> 3] >> ((byte)uVar10 & 7) & 1) <<
                                        (uVar31 & 0x1f));
                      uVar10 = uVar10 + 1;
                      uVar31 = uVar31 + 1;
                    } while (uVar12 != uVar31);
                    uVar18 = uVar18 + 1 + (ulong)(uVar12 - 1);
                  }
                  uVar10 = (ulong)(iVar32 + DISTANCEBASE[uVar13]);
                  if (uVar17 < uVar10) {
                    local_110 = (size_t *)0x34;
                  }
                  else {
                    uVar23 = uVar29 + uVar17;
                    if (uVar24 < uVar23) {
                      uVar13 = uVar23 * 3 >> 1;
                      if (uVar24 * 2 < uVar23) {
                        uVar13 = uVar23;
                      }
                      puVar11 = (uchar *)realloc(local_108,uVar13);
                      bVar33 = puVar11 == (uchar *)0x0;
                      if (!bVar33) {
                        uVar24 = uVar13;
                        local_108 = puVar11;
                      }
                    }
                    else {
                      bVar33 = false;
                    }
                    if (!bVar33) {
                      if (uVar10 < uVar29) {
                        do {
                          local_108[uVar17] = local_108[uVar17 - uVar10];
                          uVar17 = uVar17 + 1;
                          uVar29 = uVar29 - 1;
                        } while (uVar29 != 0);
                      }
                      else {
                        memcpy(local_108 + uVar17,local_108 + (uVar17 - uVar10),uVar29);
                        uVar17 = uVar23;
                      }
                      bVar33 = true;
                      uVar25 = uVar17;
                      local_c8 = uVar23;
                      goto LAB_0030b1ea;
                    }
                    local_110 = (size_t *)0x53;
                  }
                }
                else {
                  local_110 = (size_t *)0x12;
                }
              }
              else if (uVar31 != 0x100) {
                local_110 = (size_t *)(ulong)(0xb - (uVar1 < uVar18));
              }
              bVar33 = false;
            }
LAB_0030b1ea:
            uVar17 = uVar25;
          } while (bVar33);
          free((void *)__ptr_00);
          free((void *)local_88._8_8_);
          free(local_78);
          free((void *)__ptr);
          free((void *)local_a8._8_8_);
          free(local_98);
          outsize = (size_t *)((ulong)outsize & 0xffffffff);
        }
        bVar33 = (int)local_110 == 0;
        if (!bVar33) {
          outsize = local_110;
        }
        outsize = (size_t *)((ulong)outsize & 0xffffffff);
        uVar17 = uVar18;
      }
    }
    else {
      outsize = (size_t *)0x34;
      bVar33 = false;
    }
    uVar9 = (uint)outsize;
  } while (bVar33);
  *local_40 = local_108;
  *local_38 = local_c8;
  return uVar9;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}